

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
write_double<double>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          double value,format_specs *spec)

{
  alignment aVar1;
  alignment aVar2;
  undefined8 uVar3;
  double_writer f;
  char *pcVar4;
  type pcVar5;
  char cVar6;
  char *str;
  size_t size;
  float_spec_handler<char> handler;
  align_spec as;
  uint uStack_2ac;
  undefined7 uStack_28f;
  write_inf_or_nan_t write_inf_or_nan;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  
  handler.type = spec->type_;
  handler.upper = false;
  internal::handle_float_type_spec<char,fmt::v5::float_spec_handler<char>&>(handler.type,&handler);
  if ((long)value < 0) {
    value = (double)((ulong)value ^ (ulong)DAT_0016f030);
    cVar6 = '-';
  }
  else if ((spec->flags_ & 1) == 0) {
    cVar6 = '\0';
  }
  else {
    cVar6 = '+';
    if ((spec->flags_ & 2) == 0) {
      cVar6 = ' ';
    }
  }
  write_inf_or_nan.spec.super_align_spec.width_ = (spec->super_align_spec).width_;
  write_inf_or_nan.spec.super_align_spec.fill_ = (spec->super_align_spec).fill_;
  write_inf_or_nan.spec._8_5_ = SUB85(*(undefined8 *)&(spec->super_align_spec).align_,0);
  uVar3 = *(undefined8 *)((long)&spec->flags_ + 1);
  write_inf_or_nan.spec.flags_._1_3_ = (undefined3)uVar3;
  write_inf_or_nan.spec._16_5_ = SUB85((ulong)uVar3 >> 0x18,0);
  write_inf_or_nan.writer = this;
  write_inf_or_nan.sign = cVar6;
  if (NAN(value)) {
    pcVar4 = "NAN";
    str = "nan";
LAB_0011b9a5:
    if (handler.upper != false) {
      str = pcVar4;
    }
    write_double<double>::write_inf_or_nan_t::operator()(&write_inf_or_nan,str);
    return;
  }
  if (INFINITY <= value) {
    pcVar4 = "INF";
    str = "inf";
    goto LAB_0011b9a5;
  }
  buffer.super_basic_buffer<char>.ptr_ = buffer.store_;
  buffer.super_basic_buffer<char>.size_ = 0;
  buffer.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_001addc8;
  buffer.super_basic_buffer<char>.capacity_ = 500;
  as.width_ = (spec->super_align_spec).width_;
  as.fill_ = (spec->super_align_spec).fill_;
  unique0x1000019a = *(undefined8 *)&(spec->super_align_spec).align_;
  write_double_sprintf<double>(this,value,(format_specs *)&as,&buffer.super_basic_buffer<char>);
  size = buffer.super_basic_buffer<char>.size_;
  aVar1 = (spec->super_align_spec).align_;
  as.width_ = (spec->super_align_spec).width_;
  as.fill_ = (spec->super_align_spec).fill_;
  aVar2 = (spec->super_align_spec).align_;
  if (aVar2 == ALIGN_DEFAULT) {
    as.align_ = ALIGN_RIGHT;
  }
  else {
    as.align_ = aVar1;
    if (aVar2 == ALIGN_NUMERIC) {
      if (cVar6 != '\0') {
        pcVar5 = internal::reserve<fmt::v5::internal::basic_buffer<char>>(&this->out_,1);
        *pcVar5 = cVar6;
        if (as.width_ != 0) {
          as.width_ = as.width_ - 1;
        }
      }
      as.align_ = ALIGN_RIGHT;
      cVar6 = '\0';
      goto LAB_0011ba71;
    }
  }
  size = (buffer.super_basic_buffer<char>.size_ + 1) - (ulong)(cVar6 == '\0');
LAB_0011ba71:
  f._9_7_ = uStack_28f;
  f.sign = cVar6;
  f.n = size;
  f.buffer = &buffer;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::double_writer>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)this
             ,size,&as,f);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&buffer);
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler<char_type> handler(spec.type());
  internal::handle_float_type_spec(spec.type(), handler);

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::fputil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(INF_SIZE + (sign ? 1 : 0), spec,
                          inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  basic_memory_buffer<char_type> buffer;
  if (FMT_USE_GRISU && sizeof(T) <= sizeof(double) &&
      std::numeric_limits<double>::is_iec559) {
    internal::fp fp_value(static_cast<double>(value));
    fp_value.normalize();
    // Find a cached power of 10 close to 1 / fp_value.
    int dec_exp = 0;
    const int min_exp = -60;
    auto dec_pow = internal::get_cached_power(
        min_exp - (fp_value.e + internal::fp::significand_size), dec_exp);
    internal::fp product = fp_value * dec_pow;
    // Generate output.
    internal::fp one(1ull << -product.e, product.e);
    uint64_t hi = product.f >> -one.e;
    uint64_t f = product.f & (one.f - 1);
    typedef back_insert_range<internal::basic_buffer<char_type>> range;
    basic_writer<range> w{range(buffer)};
    w.write(hi);
    size_t digits = buffer.size();
    w.write('.');
    const unsigned max_digits = 18;
    while (digits++ < max_digits) {
      f *= 10;
      w.write(static_cast<char>('0' + (f >> -one.e)));
      f &= one.f - 1;
    }
    w.write('e');
    w.write(-dec_exp);
  } else {
    format_specs normalized_spec(spec);
    normalized_spec.type_ = handler.type;
    write_double_sprintf(value, normalized_spec, buffer);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = sign;
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(n, as, double_writer{n, sign, buffer});
}